

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

void number_blks_r(opt_state_t *opt_state,icode *ic,block *p)

{
  int iVar1;
  int n;
  block *p_local;
  icode *ic_local;
  opt_state_t *opt_state_local;
  
  if ((p != (block *)0x0) && (p->mark != ic->cur_mark)) {
    p->mark = ic->cur_mark;
    iVar1 = opt_state->n_blocks;
    opt_state->n_blocks = iVar1 + 1;
    p->id = iVar1;
    opt_state->blocks[iVar1] = p;
    number_blks_r(opt_state,ic,(p->et).succ);
    number_blks_r(opt_state,ic,(p->ef).succ);
  }
  return;
}

Assistant:

static void
number_blks_r(opt_state_t *opt_state, struct icode *ic, struct block *p)
{
	int n;

	if (p == 0 || isMarked(ic, p))
		return;

	Mark(ic, p);
	n = opt_state->n_blocks++;
	p->id = n;
	opt_state->blocks[n] = p;

	number_blks_r(opt_state, ic, JT(p));
	number_blks_r(opt_state, ic, JF(p));
}